

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O2

int main(int argc,char **argv)

{
  ssh_key *psVar1;
  ssh_keyalg *psVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  cmdline_instance *pcVar6;
  cmdline_instance *ptr;
  Filename *pFVar7;
  ssh2_userkey *ptr_00;
  char *pcVar8;
  size_t sVar9;
  strbuf *psVar10;
  AuthPolicy_ssh2_pubkey *pAVar11;
  RSAKey *pRVar12;
  ssh_key **ppsVar13;
  FILE *__stream;
  AuthPolicy_ssh1_pubkey *rsa;
  server_config *cfg;
  Socket *pSVar14;
  SockAddr *listenaddr;
  Plug *plug;
  int *piVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  Conf *conf;
  FILE *pFVar19;
  ulong uVar20;
  bool bVar21;
  ptrlen pVar22;
  int local_8c;
  char *val;
  char **argv_local;
  char *local_78;
  char *error_2;
  char *error;
  size_t local_60;
  size_t local_58;
  BinarySourceError local_50;
  BinarySource *local_48;
  size_t instancessize;
  
  instancessize = 8;
  argv_local = argv;
  pcVar6 = (cmdline_instance *)safemalloc(8,0x110,0);
  init_cmdline_instance(pcVar6);
  if (argc < 2) {
    show_help((FILE *)_stderr);
    fputc(10,_stderr);
  }
  pcVar18 = (char *)0x1;
  ptr = pcVar6;
LAB_0010f0ad:
  local_8c = argc + -1;
  if (argc < 2) {
    pcVar6 = ptr;
    pcVar8 = pcVar18;
    if ((pcVar18 < (char *)0x2) || (listen_once != '\x01')) goto LAB_0010fbbe;
    pcVar18 = "%s: cannot listen once only with multiple server instances\n";
    goto LAB_0010fe52;
  }
  pcVar8 = argv_local[1];
  argv_local = argv_local + 1;
  iVar4 = strcmp(pcVar8,"--help");
  if (iVar4 == 0) {
    show_help(_stdout);
LAB_0010fde3:
    exit(0);
  }
  _Var3 = longoptnoarg(pcVar8,"--version");
  if (_Var3) {
    pcVar18 = buildinfo("\n");
    printf("%s: %s\n%s\n","Uppity","Unidentified build",pcVar18);
    safefree(pcVar18);
    goto LAB_0010fde3;
  }
  _Var3 = longoptnoarg(pcVar8,"--verbose");
  if ((_Var3) || (((*pcVar8 == '-' && (pcVar8[1] == 'v')) && (pcVar8[2] == '\0')))) {
    verbose = 1;
    argc = local_8c;
    goto LAB_0010f0ad;
  }
  _Var3 = longoptnoarg(pcVar8,"--and");
  if (_Var3) {
    ptr = (cmdline_instance *)safegrowarray(ptr,&instancessize,0x110,(size_t)pcVar18,1,false);
    pcVar6 = ptr + (long)pcVar18;
    init_cmdline_instance(pcVar6);
    pcVar18 = pcVar18 + 1;
    argc = local_8c;
    goto LAB_0010f0ad;
  }
  _Var3 = longoptarg(pcVar8,"--listen",&val,&local_8c,&argv_local);
  if (_Var3) {
    if (*val == '/') {
      pcVar6->listen_port = -1;
      pcVar6->listen_socket = val;
      argc = local_8c;
    }
    else {
      iVar4 = atoi(val);
      pcVar6->listen_port = iVar4;
      pcVar6->listen_socket = (char *)0x0;
      argc = local_8c;
    }
    goto LAB_0010f0ad;
  }
  iVar4 = strcmp(pcVar8,"--listen-once");
  if (iVar4 == 0) {
    listen_once = '\x01';
    argc = local_8c;
    goto LAB_0010f0ad;
  }
  _Var3 = longoptarg(pcVar8,"--hostkey",&val,&local_8c,&argv_local);
  if (!_Var3) {
    _Var3 = longoptarg(pcVar8,"--rsakexkey",&val,&local_8c,&argv_local);
    pcVar17 = val;
    if (_Var3) {
      pFVar7 = filename_from_str(val);
      iVar4 = key_type(pFVar7);
      pFVar19 = _stderr;
      if (iVar4 != 2) {
        error_2 = key_type_to_str(iVar4);
        pcVar18 = "%s: \'%s\' is not loadable as an SSH-1 format private key (%s)";
        goto LAB_0010fe11;
      }
      pRVar12 = (pcVar6->ssc).rsa_kex_key;
      if (pRVar12 == (RSAKey *)0x0) {
        pRVar12 = (RSAKey *)safemalloc(1,0x48,0);
        (pcVar6->ssc).rsa_kex_key = pRVar12;
      }
      else {
        freersakey(pRVar12);
        pRVar12 = (pcVar6->ssc).rsa_kex_key;
      }
      iVar4 = rsa1_load_f(pFVar7,pRVar12,(char *)0x0,&error);
      if (iVar4 == 0) {
        pcVar18 = "%s: unable to load RSA kex key \'%s\': %s\n";
        pFVar19 = _stderr;
        error_2 = error;
        goto LAB_0010fe11;
      }
      (((pcVar6->ssc).rsa_kex_key)->sshk).vt = &ssh_rsa;
      argc = local_8c;
      goto LAB_0010f0ad;
    }
    _Var3 = longoptarg(pcVar8,"--userkey",&val,&local_8c,&argv_local);
    if (_Var3) {
      local_78 = val;
      pFVar7 = filename_from_str(val);
      iVar4 = key_type(pFVar7);
      pFVar19 = _stderr;
      if (iVar4 - 9U < 2) {
        psVar10 = strbuf_new();
        _Var3 = ppk_loadpub_f(pFVar7,(char **)0x0,psVar10->binarysink_,(char **)0x0,&error_2);
        if (!_Var3) {
LAB_0010ff56:
          pcVar18 = "%s: unable to load user key \'%s\': %s\n";
          pcVar17 = local_78;
          pFVar19 = _stderr;
          goto LAB_0010fe11;
        }
        pAVar11 = (AuthPolicy_ssh2_pubkey *)safemalloc(1,0x18,psVar10->len);
        memcpy(pAVar11 + 1,psVar10->u,psVar10->len);
        sVar9 = psVar10->len;
        (pAVar11->public_blob).ptr = pAVar11 + 1;
        (pAVar11->public_blob).len = sVar9;
        pAVar11->next = (pcVar6->aps).ssh2keys;
        (pcVar6->aps).ssh2keys = pAVar11;
      }
      else {
        if (iVar4 != 8) {
          error_2 = key_type_to_str(iVar4);
          pcVar18 = "%s: \'%s\' is not loadable as a public key (%s)\n";
          pcVar17 = local_78;
          goto LAB_0010fe11;
        }
        psVar10 = strbuf_new();
        iVar4 = rsa1_loadpub_f(pFVar7,psVar10->binarysink_,(char **)0x0,&error_2);
        if (iVar4 == 0) goto LAB_0010ff56;
        rsa = (AuthPolicy_ssh1_pubkey *)safemalloc(1,0x50,0);
        local_58 = psVar10->len;
        local_60 = 0;
        error = (char *)psVar10->u;
        local_50 = BSE_NO_ERROR;
        local_48 = (BinarySource *)&error;
        BinarySource_get_rsa_ssh1_pub(local_48,(RSAKey *)rsa,RSA_SSH1_EXPONENT_FIRST);
        rsa->next = (pcVar6->aps).ssh1keys;
        (pcVar6->aps).ssh1keys = rsa;
      }
      strbuf_free(psVar10);
      argc = local_8c;
      goto LAB_0010f0ad;
    }
    _Var3 = longoptarg(pcVar8,"--bannerfile",&val,&local_8c,&argv_local);
    if (!_Var3) {
      _Var3 = longoptarg(pcVar8,"--bannertext",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).banner = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--sessiondir",&val,&local_8c,&argv_local);
      if (_Var3) {
        (pcVar6->ssc).session_starting_dir = val;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-kex",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[0] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-hostkey",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[1] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-cscipher",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[2] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-csmac",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[4] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-cscomp",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[6] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-sccipher",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[3] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-scmac",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[5] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--kexinit-sccomp",&val,&local_8c,&argv_local);
      if (_Var3) {
        pVar22 = ptrlen_from_asciz(val);
        (pcVar6->ssc).kex_override[7] = pVar22;
        argc = local_8c;
        goto LAB_0010f0ad;
      }
      _Var3 = longoptarg(pcVar8,"--allow-auth",&val,&local_8c,&argv_local);
      pcVar17 = val;
      if (_Var3) {
        uVar5 = auth_method_from_name(val);
        pcVar8 = pcVar17;
        if (uVar5 != 0) {
          pcVar6->auth_methods = pcVar6->auth_methods | uVar5;
          argc = local_8c;
          goto LAB_0010f0ad;
        }
      }
      else {
        _Var3 = longoptarg(pcVar8,"--deny-auth",&val,&local_8c,&argv_local);
        pcVar17 = val;
        if (!_Var3) {
          _Var3 = longoptarg(pcVar8,"--ssh1-ciphers",&val,&local_8c,&argv_local);
          if (_Var3) {
            _error = ptrlen_from_asciz(val);
            uVar20 = 0;
            while( true ) {
              pVar22 = ptrlen_get_word((ptrlen *)&error,",");
              if (pVar22.len == 0) break;
              _Var3 = ptrlen_eq_string(pVar22,"3des");
              uVar16 = 8;
              if (!_Var3) {
                _Var3 = ptrlen_eq_string(pVar22,"blowfish");
                uVar16 = 0x40;
                if (!_Var3) {
                  _Var3 = ptrlen_eq_string(pVar22,"des");
                  pFVar19 = _stderr;
                  uVar16 = 4;
                  if (!_Var3) {
                    uVar5 = string_length_for_printf(pVar22.len);
                    fprintf(pFVar19,"%s: unrecognised SSH-1 cipher \'%.*s\'\n","Uppity",(ulong)uVar5
                            ,pVar22.ptr);
                    goto LAB_0010fe59;
                  }
                }
              }
              uVar20 = uVar20 | uVar16;
            }
            (pcVar6->ssc).ssh1_cipher_mask = uVar20;
            argc = local_8c;
            goto LAB_0010f0ad;
          }
          _Var3 = longoptnoarg(pcVar8,"--ssh1-no-compression");
          if (_Var3) {
            (pcVar6->ssc).ssh1_allow_compression = false;
            argc = local_8c;
            goto LAB_0010f0ad;
          }
          _Var3 = longoptnoarg(pcVar8,"--exitsignum");
          if (_Var3) {
            (pcVar6->ssc).exit_signal_numeric = true;
            argc = local_8c;
            goto LAB_0010f0ad;
          }
          _Var3 = longoptarg(pcVar8,"--sshlog",&val,&local_8c,&argv_local);
          if ((_Var3) || (_Var3 = longoptarg(pcVar8,"-sshlog",&val,&local_8c,&argv_local), _Var3)) {
            pFVar7 = filename_from_str(val);
            conf_set_filename(pcVar6->conf,0x81,pFVar7);
            filename_free(pFVar7);
            conf = pcVar6->conf;
            iVar4 = 3;
          }
          else {
            _Var3 = longoptarg(pcVar8,"--sshrawlog",&val,&local_8c,&argv_local);
            if ((!_Var3) &&
               (_Var3 = longoptarg(pcVar8,"-sshrawlog",&val,&local_8c,&argv_local), !_Var3)) {
              iVar4 = strcmp(pcVar8,"--pretend-to-accept-any-pubkey");
              if (iVar4 == 0) {
                (pcVar6->ssc).stunt_pretend_to_accept_any_pubkey = true;
                argc = local_8c;
              }
              else {
                iVar4 = strcmp(pcVar8,"--open-unconditional-agent-socket");
                if (iVar4 == 0) {
                  (pcVar6->ssc).stunt_open_unconditional_agent_socket = true;
                  argc = local_8c;
                }
                else {
                  iVar4 = strcmp(pcVar8,"--allow-none-auth");
                  if (iVar4 == 0) {
                    *(byte *)&pcVar6->auth_methods = (byte)pcVar6->auth_methods | 1;
                    argc = local_8c;
                  }
                  else {
                    iVar4 = strcmp(pcVar8,"--allow-trivial-ki-auth");
                    if (iVar4 == 0) {
                      (pcVar6->ssc).stunt_allow_trivial_ki_auth = true;
                      argc = local_8c;
                    }
                    else {
                      iVar4 = strcmp(pcVar8,"--return-success-to-pubkey-offer");
                      if (iVar4 != 0) {
                        pcVar18 = "%s: unrecognised option \'%s\'\n";
                        goto LAB_0010ff4a;
                      }
                      (pcVar6->ssc).stunt_return_success_to_pubkey_offer = true;
                      argc = local_8c;
                    }
                  }
                }
              }
              goto LAB_0010f0ad;
            }
            pFVar7 = filename_from_str(val);
            conf_set_filename(pcVar6->conf,0x81,pFVar7);
            filename_free(pFVar7);
            conf = pcVar6->conf;
            iVar4 = 4;
          }
          conf_set_int(conf,0x82,iVar4);
          conf_set_int(pcVar6->conf,0x83,1);
          argc = local_8c;
          goto LAB_0010f0ad;
        }
        uVar5 = auth_method_from_name(val);
        pcVar8 = pcVar17;
        if (uVar5 != 0) {
          pcVar6->auth_methods = pcVar6->auth_methods & ~uVar5;
          argc = local_8c;
          goto LAB_0010f0ad;
        }
      }
      pcVar18 = "%s: unrecognised auth method \'%s\'\n";
LAB_0010ff4a:
      fprintf(_stderr,pcVar18,"Uppity",pcVar8);
      goto LAB_0010fe59;
    }
    local_78 = val;
    __stream = fopen(val,"r");
    pFVar19 = _stderr;
    if (__stream == (FILE *)0x0) {
      piVar15 = __errno_location();
      error_2 = strerror(*piVar15);
      pcVar18 = "%s: %s: open: %s\n";
      pcVar17 = local_78;
      goto LAB_0010fe11;
    }
    psVar10 = strbuf_new();
    _Var3 = read_file_into(psVar10->binarysink_,(FILE *)__stream);
    pFVar19 = _stderr;
    if (!_Var3) {
      piVar15 = __errno_location();
      error_2 = strerror(*piVar15);
      pcVar18 = "%s: %s: read: %s\n";
      pcVar17 = local_78;
      goto LAB_0010fe11;
    }
    fclose(__stream);
    sVar9 = psVar10->len;
    (pcVar6->ssc).banner.ptr = psVar10->u;
    (pcVar6->ssc).banner.len = sVar9;
    argc = local_8c;
    goto LAB_0010f0ad;
  }
  local_78 = val;
  pFVar7 = filename_from_str(val);
  iVar4 = key_type(pFVar7);
  pFVar19 = _stderr;
  if (iVar4 != 2) {
    if (iVar4 != 3) {
      error_2 = key_type_to_str(iVar4);
      pcVar18 = "%s: \'%s\' is not loadable as a private key (%s)";
      pcVar17 = local_78;
      goto LAB_0010fe11;
    }
    ptr_00 = ppk_load_f(pFVar7,(char *)0x0,&error);
    filename_free(pFVar7);
    if ((ptr_00 == (ssh2_userkey *)0x0) || (psVar1 = ptr_00->key, psVar1 == (ssh_key *)0x0))
    goto LAB_0010fe61;
    pcVar8 = (*psVar1->vt->invalid)(psVar1,0);
    if (pcVar8 != (char *)0x0) {
      pcVar18 = "%s: host key \'%s\' is unusable: %s\n";
      pcVar17 = local_78;
      pFVar19 = _stderr;
      error_2 = pcVar8;
      goto LAB_0010fe11;
    }
    psVar1 = ptr_00->key;
    safefree(ptr_00->comment);
    safefree(ptr_00);
    sVar9 = 0;
    while (pcVar6->nhostkeys != sVar9) {
      ppsVar13 = pcVar6->hostkeys + sVar9;
      psVar2 = psVar1->vt;
      sVar9 = sVar9 + 1;
      if ((*ppsVar13)->vt == psVar2) {
        pcVar18 = "%s: host key \'%s\' duplicates key type %s\n";
        pcVar17 = local_78;
        pFVar19 = _stderr;
        error_2 = psVar2->ssh_id;
        goto LAB_0010fe11;
      }
    }
    ppsVar13 = (ssh_key **)
               safegrowarray(pcVar6->hostkeys,&pcVar6->hostkeysize,8,pcVar6->nhostkeys,1,false);
    pcVar6->hostkeys = ppsVar13;
    sVar9 = pcVar6->nhostkeys;
    pcVar6->nhostkeys = sVar9 + 1;
    ppsVar13[sVar9] = psVar1;
    argc = local_8c;
    goto LAB_0010f0ad;
  }
  if (pcVar6->hostkey1 != (RSAKey *)0x0) {
    pcVar18 = "%s: host key \'%s\' is a redundant SSH-1 host key\n";
    pcVar8 = local_78;
    goto LAB_0010ff4a;
  }
  pRVar12 = (RSAKey *)safemalloc(1,0x48,0);
  pcVar6->hostkey1 = pRVar12;
  iVar4 = rsa1_load_f(pFVar7,pRVar12,(char *)0x0,&error);
  argc = local_8c;
  if (iVar4 != 0) goto LAB_0010f0ad;
LAB_0010fe61:
  pcVar18 = "%s: unable to load host key \'%s\': %s\n";
  pcVar17 = local_78;
  pFVar19 = _stderr;
  error_2 = error;
LAB_0010fe11:
  fprintf(pFVar19,pcVar18,"Uppity",pcVar17,error_2);
  goto LAB_0010fe59;
code_r0x0010fbc4:
  random_ref();
  putty_signal(0xd,(_func_void_int *)0x1);
  sk_init();
  uxsel_init();
  do {
    pcVar8 = pcVar18 + -1;
    if (pcVar18 == (char *)0x0) {
      cli_main_loop(cliloop_no_pw_setup,cliloop_no_pw_check,cliloop_always_continue,(void *)0x0);
      return 0;
    }
    cfg = (server_config *)safemalloc(1,0x50,0);
    uVar5 = cmdline_instance_start_next_server_config_id + 1;
    cfg->config_id = cmdline_instance_start_next_server_config_id;
    cmdline_instance_start_next_server_config_id = uVar5;
    cfg->conf = ptr->conf;
    cfg->ssc = &ptr->ssc;
    cfg->hostkeys = ptr->hostkeys;
    cfg->nhostkeys = (int)ptr->nhostkeys;
    cfg->hostkey1 = ptr->hostkey1;
    cfg->ap_shared = &ptr->aps;
    cfg->auth_methods = ptr->auth_methods;
    iVar4 = ptr->listen_port;
    if (iVar4 < 0) {
      pcVar18 = ptr->listen_socket;
      local_78 = pcVar8;
      if (pcVar18 != (char *)0x0) {
        listening = 1;
        (cfg->listening_plug).vt = &server_plugvt;
        listenaddr = unix_sock_addr(pcVar18);
        pSVar14 = new_unix_listener(listenaddr,&cfg->listening_plug);
        cfg->listening_socket = pSVar14;
        pcVar18 = dupprintf("serv#%u: listening on Unix socket %s",(ulong)cfg->config_id,
                            ptr->listen_socket);
        pcVar8 = local_78;
        goto LAB_0010fcfd;
      }
      plug = server_conn_plug(cfg,(server_instance **)&error);
      pSVar14 = make_fd_socket(0,1,-1,(SockAddr *)0x0,0,plug);
      ssh_server_start(plug,pSVar14);
      log_to_stderr(*(uint *)error,"speaking SSH on stdio");
      pcVar18 = local_78;
    }
    else {
      listening = 1;
      (cfg->listening_plug).vt = &server_plugvt;
      pSVar14 = sk_newlistener((char *)0x0,iVar4,&cfg->listening_plug,true,0);
      cfg->listening_socket = pSVar14;
      pcVar18 = dupprintf("serv#%u: listening on port %d",(ulong)cfg->config_id,
                          (ulong)(uint)ptr->listen_port);
LAB_0010fcfd:
      log_to_stderr(0xffffffff,pcVar18);
      safefree(pcVar18);
      pcVar18 = pcVar8;
    }
    ptr = ptr + 1;
  } while( true );
LAB_0010fbbe:
  bVar21 = pcVar8 == (char *)0x0;
  pcVar8 = pcVar8 + -1;
  if (bVar21) goto code_r0x0010fbc4;
  if ((pcVar6->nhostkeys != 0) || (pcVar6->hostkey1 != (RSAKey *)0x0)) {
    if ((((char *)0x1 < pcVar18) && (pcVar6->listen_port < 0)) &&
       (pcVar6->listen_socket == (char *)0x0)) {
      pcVar18 = "%s: cannot talk to stdio with multiple server instances\n";
      goto LAB_0010fe52;
    }
    pcVar6 = pcVar6 + 1;
    goto LAB_0010fbbe;
  }
  pcVar18 = "%s: specify at least one host key\n";
LAB_0010fe52:
  fprintf(_stderr,pcVar18,"Uppity");
LAB_0010fe59:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    size_t ninstances = 0, instancessize = 8;
    struct cmdline_instance *instances = snewn(
        instancessize, struct cmdline_instance);
    struct cmdline_instance *ci = &instances[ninstances++];
    init_cmdline_instance(ci);

    if (argc <= 1) {
        /*
         * We're going to terminate with an error message below,
         * because there are no host keys. But we'll display the help
         * as additional standard-error output, if nothing else so
         * that people see the giant safety warning.
         */
        show_help(stderr);
        fputc('\n', stderr);
    }

    while (--argc > 0) {
        const char *arg = *++argv;
        const char *val;

        if (!strcmp(arg, "--help")) {
            show_help(stdout);
            exit(0);
        } else if (longoptnoarg(arg, "--version")) {
            show_version_and_exit();
        } else if (longoptnoarg(arg, "--verbose") || !strcmp(arg, "-v")) {
            verbose = true;
        } else if (longoptnoarg(arg, "--and")) {
            sgrowarray(instances, instancessize, ninstances);
            ci = &instances[ninstances++];
            init_cmdline_instance(ci);
        } else if (longoptarg(arg, "--listen", &val, &argc, &argv)) {
            if (val[0] == '/') {
                ci->listen_port = -1;
                ci->listen_socket = val;
            } else {
                ci->listen_port = atoi(val);
                ci->listen_socket = NULL;
            }
        } else if (!strcmp(arg, "--listen-once")) {
            listen_once = true;
        } else if (longoptarg(arg, "--hostkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2) {
                ssh2_userkey *uk;
                ssh_key *key;
                uk = ppk_load_f(keyfile, NULL, &error);
                filename_free(keyfile);
                if (!uk || !uk->key) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
                char *invalid = ssh_key_invalid(uk->key, 0);
                if (invalid) {
                    fprintf(stderr, "%s: host key '%s' is unusable: "
                            "%s\n", appname, val, invalid);
                    exit(1);
                }
                key = uk->key;
                sfree(uk->comment);
                sfree(uk);

                for (int i = 0; i < ci->nhostkeys; i++)
                    if (ssh_key_alg(ci->hostkeys[i]) == ssh_key_alg(key)) {
                        fprintf(stderr, "%s: host key '%s' duplicates key "
                                "type %s\n", appname, val,
                                ssh_key_alg(key)->ssh_id);
                        exit(1);
                    }

                sgrowarray(ci->hostkeys, ci->hostkeysize, ci->nhostkeys);
                ci->hostkeys[ci->nhostkeys++] = key;
            } else if (keytype == SSH_KEYTYPE_SSH1) {
                if (ci->hostkey1) {
                    fprintf(stderr, "%s: host key '%s' is a redundant "
                            "SSH-1 host key\n", appname, val);
                    exit(1);
                }
                ci->hostkey1 = snew(RSAKey);
                if (!rsa1_load_f(keyfile, ci->hostkey1, NULL, &error)) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--rsakexkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype != SSH_KEYTYPE_SSH1) {
                fprintf(stderr, "%s: '%s' is not loadable as an SSH-1 format "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }

            if (ci->ssc.rsa_kex_key) {
                freersakey(ci->ssc.rsa_kex_key);
            } else {
                ci->ssc.rsa_kex_key = snew(RSAKey);
            }

            if (!rsa1_load_f(keyfile, ci->ssc.rsa_kex_key, NULL, &error)) {
                fprintf(stderr, "%s: unable to load RSA kex key '%s': "
                        "%s\n", appname, val, error);
                exit(1);
            }

            ci->ssc.rsa_kex_key->sshk.vt = &ssh_rsa;
        } else if (longoptarg(arg, "--userkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
                strbuf *sb = strbuf_new();
                struct AuthPolicy_ssh2_pubkey *node;
                void *blob;

                if (!ppk_loadpub_f(keyfile, NULL, BinarySink_UPCAST(sb),
                                   NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew_plus(struct AuthPolicy_ssh2_pubkey, sb->len);
                blob = snew_plus_get_aux(node);
                memcpy(blob, sb->u, sb->len);
                node->public_blob = make_ptrlen(blob, sb->len);

                node->next = ci->aps.ssh2keys;
                ci->aps.ssh2keys = node;

                strbuf_free(sb);
            } else if (keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
                strbuf *sb = strbuf_new();
                BinarySource src[1];
                struct AuthPolicy_ssh1_pubkey *node;

                if (!rsa1_loadpub_f(keyfile, BinarySink_UPCAST(sb),
                                    NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew(struct AuthPolicy_ssh1_pubkey);
                BinarySource_BARE_INIT(src, sb->u, sb->len);
                get_rsa_ssh1_pub(src, &node->key, RSA_SSH1_EXPONENT_FIRST);

                node->next = ci->aps.ssh1keys;
                ci->aps.ssh1keys = node;

                strbuf_free(sb);
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a public key "
                        "(%s)\n", appname, val, key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--bannerfile", &val, &argc, &argv)) {
            FILE *fp = fopen(val, "r");
            if (!fp) {
                fprintf(stderr, "%s: %s: open: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            strbuf *sb = strbuf_new();
            if (!read_file_into(BinarySink_UPCAST(sb), fp)) {
                fprintf(stderr, "%s: %s: read: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            fclose(fp);
            ci->ssc.banner = ptrlen_from_strbuf(sb);
        } else if (longoptarg(arg, "--bannertext", &val, &argc, &argv)) {
            ci->ssc.banner = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--sessiondir", &val, &argc, &argv)) {
            ci->ssc.session_starting_dir = val;
        } else if (longoptarg(arg, "--kexinit-kex", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_KEX] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-hostkey", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_HOSTKEY] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-csmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-scmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--allow-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods |= method;
        } else if (longoptarg(arg, "--deny-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods &= ~method;
        } else if (longoptarg(arg, "--ssh1-ciphers", &val, &argc, &argv)) {
            ptrlen list = ptrlen_from_asciz(val);
            ptrlen word;
            unsigned long mask = 0;
            while (word = ptrlen_get_word(&list, ","), word.len != 0) {

#define SSH1_CIPHER_CASE(bitpos, name)                  \
                if (ptrlen_eq_string(word, name)) {     \
                    mask |= 1U << bitpos;               \
                    continue;                           \
                }
                SSH1_SUPPORTED_CIPHER_LIST(SSH1_CIPHER_CASE);
#undef SSH1_CIPHER_CASE

                fprintf(stderr, "%s: unrecognised SSH-1 cipher '%.*s'\n",
                        appname, PTRLEN_PRINTF(word));
                exit(1);
            }
            ci->ssc.ssh1_cipher_mask = mask;
        } else if (longoptnoarg(arg, "--ssh1-no-compression")) {
            ci->ssc.ssh1_allow_compression = false;
        } else if (longoptnoarg(arg, "--exitsignum")) {
            ci->ssc.exit_signal_numeric = true;
        } else if (longoptarg(arg, "--sshlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_PACKETS);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (longoptarg(arg, "--sshrawlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshrawlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_SSHRAW);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (!strcmp(arg, "--pretend-to-accept-any-pubkey")) {
            ci->ssc.stunt_pretend_to_accept_any_pubkey = true;
        } else if (!strcmp(arg, "--open-unconditional-agent-socket")) {
            ci->ssc.stunt_open_unconditional_agent_socket = true;
        } else if (!strcmp(arg, "--allow-none-auth")) {
            /* backwards-compatibility synonym for --allow-auth=none */
            ci->auth_methods |= AUTHMETHOD_NONE;
        } else if (!strcmp(arg, "--allow-trivial-ki-auth")) {
            ci->ssc.stunt_allow_trivial_ki_auth = true;
        } else if (!strcmp(arg, "--return-success-to-pubkey-offer")) {
            ci->ssc.stunt_return_success_to_pubkey_offer = true;
        } else {
            fprintf(stderr, "%s: unrecognised option '%s'\n", appname, arg);
            exit(1);
        }
    }

    if (ninstances > 1 && listen_once) {
        fprintf(stderr, "%s: cannot listen once only with multiple server "
                "instances\n", appname);
        exit(1);
    }
    for (size_t i = 0; i < ninstances; i++) {
        ci = &instances[i];
        if (ci->nhostkeys == 0 && !ci->hostkey1) {
            fprintf(stderr, "%s: specify at least one host key\n", appname);
            exit(1);
        }
        if (ninstances > 1 && !(ci->listen_port >= 0 || ci->listen_socket)) {
            fprintf(stderr, "%s: cannot talk to stdio with multiple server "
                    "instances\n", appname);
            exit(1);
        }
    }

    random_ref();

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    for (size_t i = 0; i < ninstances; i++)
        cmdline_instance_start(&instances[i]);

    cli_main_loop(cliloop_no_pw_setup, cliloop_no_pw_check,
                  cliloop_always_continue, NULL);

    return 0;
}